

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<float>(CImg<unsigned_char> *this,float *min_val)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  uint uVar7;
  CImgInstanceException *this_00;
  char *pcVar8;
  char *pcVar9;
  byte *pbVar10;
  float *in_RSI;
  CImg<unsigned_char> *in_RDI;
  uchar val;
  uchar *ptrs;
  uchar min_value;
  uchar max_value;
  uchar *ptr_max;
  byte *local_38;
  byte local_2a;
  byte local_29;
  byte *local_28;
  
  bVar6 = is_empty(in_RDI);
  if (bVar6) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
    uVar7 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar8 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar8 = "";
    }
    pcVar9 = pixel_type();
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min() : Empty instance.",
               (ulong)uVar7,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar8,pcVar9);
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,
                CImgInstanceException::~CImgInstanceException);
  }
  local_28 = in_RDI->_data;
  local_29 = *local_28;
  puVar5 = in_RDI->_data;
  uVar7 = size(in_RDI);
  local_38 = puVar5 + uVar7;
  local_2a = local_29;
  while (pbVar10 = local_38 + -1, in_RDI->_data < local_38) {
    bVar1 = *pbVar10;
    if (local_29 < bVar1) {
      local_29 = bVar1;
      local_28 = pbVar10;
    }
    local_38 = pbVar10;
    if (bVar1 < local_2a) {
      local_2a = bVar1;
    }
  }
  *in_RSI = (float)local_2a;
  return local_28;
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min() : Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }